

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O0

QString * RelocEntryWrapper::translateType(QString *__return_storage_ptr__,WORD type)

{
  WORD type_local;
  
  switch(type) {
  case 0:
    QString::QString(__return_storage_ptr__,"Padding (skipped)");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"High WORD of 32-bit field");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"Low  WORD of 32-bit field");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"32 bit field");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"HighAdj");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"MIPS JumpAddr");
    break;
  case 6:
  case 7:
    QString::QString(__return_storage_ptr__,"Reserved");
    break;
  default:
    QString::QString(__return_storage_ptr__,"");
    break;
  case 9:
    QString::QString(__return_storage_ptr__,"MIPS16 JumpAddr");
    break;
  case 10:
    QString::QString(__return_storage_ptr__,"64 bit field");
  }
  return __return_storage_ptr__;
}

Assistant:

QString RelocEntryWrapper::translateType(WORD type)
{
    switch (type) {
        case 0 : return "Padding (skipped)";
        case 1 : return "High WORD of 32-bit field";
        case 2 : return "Low  WORD of 32-bit field";
        case 3 : return "32 bit field";
        case 4 : return "HighAdj";
        case 5 : return "MIPS JumpAddr";
        case 6 : case 7 : return "Reserved";
        case 9 : return "MIPS16 JumpAddr";
        case 10 : return "64 bit field";
    }
    return "";
}